

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

void __thiscall
llvm::DWARFDebugLine::Prologue::dump(Prologue *this,raw_ostream *OS,DIDumpOptions DumpOptions)

{
  DIDumpOptions DumpOpts;
  bool bVar1;
  uint16_t uVar2;
  raw_ostream *prVar3;
  ulong uVar4;
  size_type sVar5;
  char **Vals;
  const_reference this_00;
  char *Fmt;
  uchar *in_R8;
  format_object<unsigned_long> local_280;
  format_object<unsigned_long> local_268;
  SmallString<32U> local_240;
  format_object<unsigned_long> local_210;
  DIDumpOptions local_1f8;
  uint local_1dc;
  format_object<unsigned_int> local_1d8;
  const_reference local_1c0;
  FileNameEntry *FileEntry;
  uint32_t I_2;
  uint32_t FileBase;
  undefined8 local_1a8;
  undefined8 local_1a0;
  uint local_194;
  format_object<unsigned_int> local_190;
  uint local_178;
  uint local_174;
  uint32_t I_1;
  uint32_t DirBase;
  char *local_160;
  format_object<const_char_*,_unsigned_char> local_158;
  uint local_134;
  undefined1 local_130 [4];
  uint32_t I;
  format_object<unsigned_char> local_118;
  format_object<signed_char> local_100;
  format_object<unsigned_char> local_e8;
  format_object<unsigned_char> local_d0;
  format_object<unsigned_char> local_b8;
  format_object<unsigned_long> local_a0;
  format_object<unsigned_char> local_88;
  uint8_t local_69;
  format_object<unsigned_char> local_68;
  uint16_t local_4a;
  format_object<unsigned_short> local_48;
  format_object<unsigned_long> local_30;
  raw_ostream *local_18;
  raw_ostream *OS_local;
  Prologue *this_local;
  
  DumpOpts = DumpOptions;
  local_18 = OS;
  OS_local = (raw_ostream *)this;
  prVar3 = raw_ostream::operator<<(OS,"Line table prologue:\n");
  format<unsigned_long>(&local_30,"    total_length: 0x%8.8lx\n",&this->TotalLength);
  prVar3 = raw_ostream::operator<<(prVar3,&local_30.super_format_object_base);
  local_4a = getVersion(this);
  format<unsigned_short>(&local_48,"         version: %u\n",&local_4a);
  raw_ostream::operator<<(prVar3,&local_48.super_format_object_base);
  uVar2 = getVersion(this);
  prVar3 = local_18;
  if (4 < uVar2) {
    local_69 = getAddressSize(this);
    format<unsigned_char>(&local_68,"    address_size: %u\n",&local_69);
    prVar3 = raw_ostream::operator<<(prVar3,&local_68.super_format_object_base);
    format<unsigned_char>(&local_88," seg_select_size: %u\n",&this->SegSelectorSize);
    raw_ostream::operator<<(prVar3,&local_88.super_format_object_base);
  }
  prVar3 = local_18;
  format<unsigned_long>(&local_a0," prologue_length: 0x%8.8lx\n",&this->PrologueLength);
  prVar3 = raw_ostream::operator<<(prVar3,&local_a0.super_format_object_base);
  format<unsigned_char>(&local_b8," min_inst_length: %u\n",&this->MinInstLength);
  prVar3 = raw_ostream::operator<<(prVar3,&local_b8.super_format_object_base);
  uVar2 = getVersion(this);
  Fmt = "";
  if (3 < uVar2) {
    Fmt = "max_ops_per_inst: %u\n";
  }
  format<unsigned_char>(&local_d0,Fmt,&this->MaxOpsPerInst);
  prVar3 = raw_ostream::operator<<(prVar3,&local_d0.super_format_object_base);
  format<unsigned_char>(&local_e8," default_is_stmt: %u\n",&this->DefaultIsStmt);
  prVar3 = raw_ostream::operator<<(prVar3,&local_e8.super_format_object_base);
  format<signed_char>(&local_100,"       line_base: %i\n",&this->LineBase);
  prVar3 = raw_ostream::operator<<(prVar3,&local_100.super_format_object_base);
  format<unsigned_char>(&local_118,"      line_range: %u\n",&this->LineRange);
  prVar3 = raw_ostream::operator<<(prVar3,&local_118.super_format_object_base);
  format<unsigned_char>
            ((format_object<unsigned_char> *)local_130,"     opcode_base: %u\n",&this->OpcodeBase);
  raw_ostream::operator<<(prVar3,(format_object_base *)local_130);
  for (local_134 = 0; uVar4 = (ulong)local_134,
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->StandardOpcodeLengths), prVar3 = local_18, uVar4 != sVar5;
      local_134 = local_134 + 1) {
    _I_1 = dwarf::LNStandardString(local_134 + 1);
    local_160 = StringRef::data((StringRef *)&I_1);
    Vals = (char **)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              (&this->StandardOpcodeLengths,(ulong)local_134);
    format<char_const*,unsigned_char>
              (&local_158,(llvm *)"standard_opcode_lengths[%s] = %u\n",(char *)&local_160,Vals,in_R8
              );
    raw_ostream::operator<<(prVar3,&local_158.super_format_object_base);
  }
  bVar1 = std::vector<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>::empty
                    (&this->IncludeDirectories);
  if (!bVar1) {
    uVar2 = getVersion(this);
    local_174 = (uint)(uVar2 < 5);
    for (local_178 = 0; uVar4 = (ulong)local_178,
        sVar5 = std::vector<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>::size
                          (&this->IncludeDirectories), prVar3 = local_18, uVar4 != sVar5;
        local_178 = local_178 + 1) {
      local_194 = local_178 + local_174;
      format<unsigned_int>(&local_190,"include_directories[%3u] = ",&local_194);
      raw_ostream::operator<<(prVar3,&local_190.super_format_object_base);
      this_00 = std::vector<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>::operator[]
                          (&this->IncludeDirectories,(ulong)local_178);
      I_2 = DumpOptions.DumpType;
      unique0x00012004 = DumpOptions.ChildRecurseDepth;
      local_1a8._0_4_ = DumpOptions.ParentRecurseDepth;
      local_1a8._4_2_ = DumpOptions.Version;
      local_1a8._6_1_ = DumpOptions.AddrSize;
      local_1a8._7_1_ = DumpOptions.ShowAddresses;
      local_1a0._0_1_ = DumpOptions.ShowChildren;
      local_1a0._1_1_ = DumpOptions.ShowParents;
      local_1a0._2_1_ = DumpOptions.ShowForm;
      local_1a0._3_1_ = DumpOptions.SummarizeTypes;
      local_1a0._4_1_ = DumpOptions.Verbose;
      local_1a0._5_1_ = DumpOptions.DisplayRawContents;
      local_1a0._6_2_ = DumpOptions._22_2_;
      DWARFFormValue::dump(this_00,local_18,DumpOpts);
      raw_ostream::operator<<(local_18,'\n');
    }
  }
  bVar1 = std::
          vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
          ::empty(&this->FileNames);
  if (!bVar1) {
    uVar2 = getVersion(this);
    FileEntry._4_4_ = (uint)(uVar2 < 5);
    for (FileEntry._0_4_ = 0; uVar4 = (ulong)(uint)FileEntry,
        sVar5 = std::
                vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                ::size(&this->FileNames), uVar4 != sVar5; FileEntry._0_4_ = (uint)FileEntry + 1) {
      local_1c0 = std::
                  vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                  ::operator[](&this->FileNames,(ulong)(uint)FileEntry);
      prVar3 = local_18;
      local_1dc = (uint)FileEntry + FileEntry._4_4_;
      format<unsigned_int>(&local_1d8,"file_names[%3u]:\n",&local_1dc);
      raw_ostream::operator<<(prVar3,&local_1d8.super_format_object_base);
      raw_ostream::operator<<(local_18,"           name: ");
      local_1f8.DumpType = DumpOptions.DumpType;
      local_1f8.ChildRecurseDepth = DumpOptions.ChildRecurseDepth;
      local_1f8.ParentRecurseDepth = DumpOptions.ParentRecurseDepth;
      local_1f8.Version = DumpOptions.Version;
      local_1f8.AddrSize = DumpOptions.AddrSize;
      local_1f8.ShowAddresses = DumpOptions.ShowAddresses;
      local_1f8.ShowChildren = DumpOptions.ShowChildren;
      local_1f8.ShowParents = DumpOptions.ShowParents;
      local_1f8.ShowForm = DumpOptions.ShowForm;
      local_1f8.SummarizeTypes = DumpOptions.SummarizeTypes;
      local_1f8.Verbose = DumpOptions.Verbose;
      local_1f8.DisplayRawContents = DumpOptions.DisplayRawContents;
      local_1f8._22_2_ = DumpOptions._22_2_;
      DWARFFormValue::dump(&local_1c0->Name,local_18,DumpOpts);
      prVar3 = raw_ostream::operator<<(local_18,'\n');
      format<unsigned_long>(&local_210,"      dir_index: %lu\n",&local_1c0->DirIdx);
      raw_ostream::operator<<(prVar3,&local_210.super_format_object_base);
      if (((this->ContentTypes).HasMD5 & 1U) != 0) {
        prVar3 = raw_ostream::operator<<(local_18,"   md5_checksum: ");
        MD5::MD5Result::digest(&local_240,&local_1c0->Checksum);
        prVar3 = raw_ostream::operator<<(prVar3,(SmallVectorImpl<char> *)&local_240);
        raw_ostream::operator<<(prVar3,'\n');
        SmallString<32U>::~SmallString(&local_240);
      }
      prVar3 = local_18;
      if (((this->ContentTypes).HasModTime & 1U) != 0) {
        format<unsigned_long>(&local_268,"       mod_time: 0x%8.8lx\n",&local_1c0->ModTime);
        raw_ostream::operator<<(prVar3,&local_268.super_format_object_base);
      }
      prVar3 = local_18;
      if (((this->ContentTypes).HasLength & 1U) != 0) {
        format<unsigned_long>(&local_280,"         length: 0x%8.8lx\n",&local_1c0->Length);
        raw_ostream::operator<<(prVar3,&local_280.super_format_object_base);
      }
      if (((this->ContentTypes).HasSource & 1U) != 0) {
        raw_ostream::operator<<(local_18,"         source: ");
        DWARFFormValue::dump(&local_1c0->Source,local_18,DumpOpts);
        raw_ostream::operator<<(local_18,'\n');
      }
    }
  }
  return;
}

Assistant:

void DWARFDebugLine::Prologue::dump(raw_ostream &OS,
                                    DIDumpOptions DumpOptions) const {
  OS << "Line table prologue:\n"
     << format("    total_length: 0x%8.8" PRIx64 "\n", TotalLength)
     << format("         version: %u\n", getVersion());
  if (getVersion() >= 5)
    OS << format("    address_size: %u\n", getAddressSize())
       << format(" seg_select_size: %u\n", SegSelectorSize);
  OS << format(" prologue_length: 0x%8.8" PRIx64 "\n", PrologueLength)
     << format(" min_inst_length: %u\n", MinInstLength)
     << format(getVersion() >= 4 ? "max_ops_per_inst: %u\n" : "", MaxOpsPerInst)
     << format(" default_is_stmt: %u\n", DefaultIsStmt)
     << format("       line_base: %i\n", LineBase)
     << format("      line_range: %u\n", LineRange)
     << format("     opcode_base: %u\n", OpcodeBase);

  for (uint32_t I = 0; I != StandardOpcodeLengths.size(); ++I)
    OS << format("standard_opcode_lengths[%s] = %u\n",
                 LNStandardString(I + 1).data(), StandardOpcodeLengths[I]);

  if (!IncludeDirectories.empty()) {
    // DWARF v5 starts directory indexes at 0.
    uint32_t DirBase = getVersion() >= 5 ? 0 : 1;
    for (uint32_t I = 0; I != IncludeDirectories.size(); ++I) {
      OS << format("include_directories[%3u] = ", I + DirBase);
      IncludeDirectories[I].dump(OS, DumpOptions);
      OS << '\n';
    }
  }

  if (!FileNames.empty()) {
    // DWARF v5 starts file indexes at 0.
    uint32_t FileBase = getVersion() >= 5 ? 0 : 1;
    for (uint32_t I = 0; I != FileNames.size(); ++I) {
      const FileNameEntry &FileEntry = FileNames[I];
      OS <<   format("file_names[%3u]:\n", I + FileBase);
      OS <<          "           name: ";
      FileEntry.Name.dump(OS, DumpOptions);
      OS << '\n'
         <<   format("      dir_index: %" PRIu64 "\n", FileEntry.DirIdx);
      if (ContentTypes.HasMD5)
        OS <<        "   md5_checksum: " << FileEntry.Checksum.digest() << '\n';
      if (ContentTypes.HasModTime)
        OS << format("       mod_time: 0x%8.8" PRIx64 "\n", FileEntry.ModTime);
      if (ContentTypes.HasLength)
        OS << format("         length: 0x%8.8" PRIx64 "\n", FileEntry.Length);
      if (ContentTypes.HasSource) {
        OS <<        "         source: ";
        FileEntry.Source.dump(OS, DumpOptions);
        OS << '\n';
      }
    }
  }
}